

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_Error tt_cmap14_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  FT_Byte *pFVar19;
  byte *pbVar20;
  uint uVar21;
  
  pbVar12 = table + 10;
  if (valid->limit < pbVar12) {
    ft_validator_error(valid,8);
  }
  uVar10 = *(uint *)(table + 2);
  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  bVar1 = table[6];
  bVar2 = table[7];
  bVar3 = table[8];
  bVar4 = table[9];
  uVar13 = (ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 | (ulong)bVar3 << 8 | (ulong)bVar4;
  if (((uVar10 < 10) || ((ulong)((long)valid->limit - (long)table) < (ulong)uVar10)) ||
     ((uVar10 - 10) / 0xb < (uint)uVar13)) {
    ft_validator_error(valid,8);
  }
  if (uVar13 != 0) {
    uVar16 = 1;
    uVar13 = 0;
    do {
      bVar5 = *pbVar12;
      bVar6 = pbVar12[1];
      bVar7 = pbVar12[2];
      uVar9 = *(uint *)(pbVar12 + 3);
      uVar11 = *(uint *)(pbVar12 + 7);
      uVar15 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18);
      uVar9 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar17 = (ulong)uVar9;
      if ((uVar10 <= uVar15) || (uVar10 <= uVar9)) {
        ft_validator_error(valid,8);
      }
      uVar9 = (uint)bVar7 | (uint)bVar6 << 8 | (uint)bVar5 << 0x10;
      if (uVar9 < uVar16) {
        ft_validator_error(valid,8);
      }
      if (uVar15 != 0) {
        pFVar19 = table + uVar15 + 4;
        if (valid->limit < pFVar19) {
          ft_validator_error(valid,8);
        }
        uVar16 = *(uint *)(table + uVar15);
        uVar14 = (ulong)(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                        uVar16 << 0x18);
        if ((ulong)((long)valid->limit - (long)pFVar19) >> 2 < uVar14) {
          ft_validator_error(valid,8);
        }
        else if (uVar14 == 0) goto LAB_002417ed;
        uVar18 = 0;
        uVar16 = 0;
        do {
          uVar11 = (uint)table[uVar18 * 4 + uVar15 + 6] |
                   (uint)table[uVar18 * 4 + uVar15 + 5] << 8 | (uint)pFVar19[uVar18 * 4] << 0x10;
          uVar21 = table[uVar18 * 4 + uVar15 + 7] + uVar11;
          if (0x10ffff < uVar21) {
            ft_validator_error(valid,8);
          }
          if (uVar11 < uVar16) {
            ft_validator_error(valid,8);
          }
          uVar16 = uVar21 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
LAB_002417ed:
      if (uVar17 != 0) {
        pbVar20 = table + uVar17 + 4;
        if (valid->limit < pbVar20) {
          ft_validator_error(valid,8);
        }
        uVar16 = *(uint *)(table + uVar17);
        uVar17 = (ulong)(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                        uVar16 << 0x18);
        if ((ulong)((long)valid->limit - (long)pbVar20) / 5 < uVar17) {
          ft_validator_error(valid,8);
        }
        else if (uVar17 == 0) goto LAB_00241902;
        uVar15 = 0;
        do {
          bVar5 = *pbVar20;
          bVar6 = pbVar20[1];
          bVar7 = pbVar20[2];
          uVar8 = *(ushort *)(pbVar20 + 3);
          if (0x10 < bVar5) {
            ft_validator_error(valid,8);
          }
          uVar14 = (ulong)bVar7 | (ulong)bVar5 << 0x10 | (ulong)bVar6 << 8;
          if (uVar14 < uVar15) {
            ft_validator_error(valid,8);
          }
          if ((valid->level != FT_VALIDATE_DEFAULT) &&
             ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar8 << 8 | uVar8 >> 8)))
          {
            ft_validator_error(valid,0x10);
          }
          uVar15 = uVar14 + 1;
          pbVar20 = pbVar20 + 5;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
LAB_00241902:
      pbVar12 = pbVar12 + 0xb;
      uVar16 = uVar9 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((ulong)CONCAT11(bVar3,bVar4) |
                       (ulong)bVar1 * 0x1000000 | (ulong)bVar2 * 0x10000));
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_selectors;


    if ( table + 2 + 4 + 4 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p             = table + 2;
    length        = TT_NEXT_ULONG( p );
    num_selectors = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 10 + 11 * num_selectors ? */
         length < 10                                 ||
         ( length - 10 ) / 11 < num_selectors        )
      FT_INVALID_TOO_SHORT;

    /* check selectors, they must be in increasing order */
    {
      /* we start lastVarSel at 1 because a variant selector value of 0
       * isn't valid.
       */
      FT_ULong  n, lastVarSel = 1;


      for ( n = 0; n < num_selectors; n++ )
      {
        FT_ULong  varSel    = TT_NEXT_UINT24( p );
        FT_ULong  defOff    = TT_NEXT_ULONG( p );
        FT_ULong  nondefOff = TT_NEXT_ULONG( p );


        if ( defOff >= length || nondefOff >= length )
          FT_INVALID_TOO_SHORT;

        if ( varSel < lastVarSel )
          FT_INVALID_DATA;

        lastVarSel = varSel + 1;

        /* check the default table (these glyphs should be reached     */
        /* through the normal Unicode cmap, no GIDs, just check order) */
        if ( defOff != 0 )
        {
          FT_Byte*  defp     = table + defOff;
          FT_ULong  numRanges;
          FT_ULong  i;
          FT_ULong  lastBase = 0;


          if ( defp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numRanges = TT_NEXT_ULONG( defp );

          /* defp + numRanges * 4 > valid->limit ? */
          if ( numRanges > (FT_ULong)( valid->limit - defp ) / 4 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numRanges; i++ )
          {
            FT_ULong  base = TT_NEXT_UINT24( defp );
            FT_ULong  cnt  = FT_NEXT_BYTE( defp );


            if ( base + cnt >= 0x110000UL )              /* end of Unicode */
              FT_INVALID_DATA;

            if ( base < lastBase )
              FT_INVALID_DATA;

            lastBase = base + cnt + 1U;
          }
        }

        /* and the non-default table (these glyphs are specified here) */
        if ( nondefOff != 0 )
        {
          FT_Byte*  ndp        = table + nondefOff;
          FT_ULong  numMappings;
          FT_ULong  i, lastUni = 0;


          if ( ndp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numMappings = TT_NEXT_ULONG( ndp );

          /* numMappings * 5 > (FT_ULong)( valid->limit - ndp ) ? */
          if ( numMappings > ( (FT_ULong)( valid->limit - ndp ) ) / 5 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numMappings; i++ )
          {
            FT_ULong  uni = TT_NEXT_UINT24( ndp );
            FT_ULong  gid = TT_NEXT_USHORT( ndp );


            if ( uni >= 0x110000UL )                     /* end of Unicode */
              FT_INVALID_DATA;

            if ( uni < lastUni )
              FT_INVALID_DATA;

            lastUni = uni + 1U;

            if ( valid->level >= FT_VALIDATE_TIGHT    &&
                 gid >= TT_VALID_GLYPH_COUNT( valid ) )
              FT_INVALID_GLYPH_ID;
          }
        }
      }
    }

    return FT_Err_Ok;
  }